

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O0

bool __thiscall
TPZMatrix<Fad<float>_>::SolveEigensystemJacobi
          (TPZMatrix<Fad<float>_> *this,int64_t *numiterations,REAL *tol,
          TPZVec<Fad<float>_> *Eigenvalues,TPZFMatrix<Fad<float>_> *Eigenvectors)

{
  bool bVar1;
  TPZVec<Fad<float>_> *in_RCX;
  double *in_RDX;
  long *in_RSI;
  TPZBaseMatrix *in_RDI;
  long *in_R8;
  float fVar2;
  Fad<float> val;
  int64_t i_9;
  Fad<float> exp_1;
  int64_t i_8;
  int64_t i_7;
  REAL norm2;
  int64_t i_6;
  double difTemp;
  double dif;
  int64_t count;
  int64_t i_5;
  int64_t i_4;
  REAL norm1;
  int64_t i_3;
  int64_t i_2;
  Fad<float> exp;
  Fad<float> answ;
  TPZFNMatrix<9,_Fad<float>_> Matrix_1;
  int64_t i_1;
  int64_t eigen;
  TPZFNMatrix<3,_Fad<float>_> VecIni_cp;
  TPZFNMatrix<3,_Fad<float>_> VecIni;
  bool result;
  int64_t j;
  int64_t i;
  TPZFNMatrix<9,_Fad<float>_> Matrix;
  int64_t size;
  REAL tolerance;
  int64_t NumIt;
  Fad<float> *in_stack_fffffffffffff448;
  Fad<float> *in_stack_fffffffffffff450;
  undefined4 in_stack_fffffffffffff458;
  float in_stack_fffffffffffff45c;
  Fad<float> *in_stack_fffffffffffff460;
  undefined4 in_stack_fffffffffffff468;
  float in_stack_fffffffffffff46c;
  TPZFMatrix<Fad<float>_> *in_stack_fffffffffffff470;
  Fad<float> *in_stack_fffffffffffff480;
  Fad<float> *in_stack_fffffffffffff488;
  Fad<float> *in_stack_fffffffffffff490;
  undefined4 in_stack_fffffffffffff4a0;
  undefined4 in_stack_fffffffffffff4a4;
  TPZFMatrix<Fad<float>_> *in_stack_fffffffffffff4a8;
  undefined4 in_stack_fffffffffffff4b0;
  float in_stack_fffffffffffff4b4;
  Fad<float> *in_stack_fffffffffffff4c8;
  undefined7 in_stack_fffffffffffff4d0;
  undefined1 in_stack_fffffffffffff4d7;
  int64_t in_stack_fffffffffffff4d8;
  TPZFNMatrix<3,_Fad<float>_> *in_stack_fffffffffffff4e0;
  undefined4 in_stack_fffffffffffff4f8;
  float in_stack_fffffffffffff4fc;
  TPZFMatrix<Fad<float>_> *in_stack_fffffffffffff500;
  long local_a48;
  Fad<float> *in_stack_fffffffffffff5d8;
  TPZVec<Fad<float>_> *in_stack_fffffffffffff5e0;
  Fad<float> *in_stack_fffffffffffff5e8;
  long local_9c0;
  long local_9b8;
  double local_9b0;
  long local_9a8;
  double local_9a0;
  double local_998;
  long local_990;
  long local_958;
  long local_950;
  double local_948;
  undefined1 local_908 [80];
  long local_8b8;
  double local_8b0;
  undefined1 local_858 [80];
  long local_808;
  undefined8 local_7d0;
  int local_504;
  long local_4e0;
  long local_4d8;
  undefined8 local_4d0;
  TPZVec<Fad<float>_> *in_stack_fffffffffffffbc0;
  REAL *in_stack_fffffffffffffbc8;
  int64_t *in_stack_fffffffffffffbd0;
  TPZMatrix<Fad<float>_> *in_stack_fffffffffffffbd8;
  undefined1 local_248 [32];
  long local_228;
  long local_220;
  int64_t local_48;
  double local_40;
  long local_38;
  long *local_30;
  TPZVec<Fad<float>_> *local_28;
  byte local_1;
  
  local_38 = *in_RSI;
  local_40 = *in_RDX;
  local_30 = in_R8;
  local_28 = in_RCX;
  local_48 = TPZBaseMatrix::Rows(in_RDI);
  TPZFNMatrix<9,_Fad<float>_>::TPZFNMatrix
            ((TPZFNMatrix<9,_Fad<float>_> *)
             CONCAT44(in_stack_fffffffffffff4b4,in_stack_fffffffffffff4b0),
             (int64_t)in_stack_fffffffffffff4a8,
             CONCAT44(in_stack_fffffffffffff4a4,in_stack_fffffffffffff4a0));
  for (local_220 = 0; local_220 < local_48; local_220 = local_220 + 1) {
    for (local_228 = 0; local_228 < local_48; local_228 = local_228 + 1) {
      (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x21])(local_248,in_RDI,local_220,local_228);
      TPZFMatrix<Fad<float>_>::operator()
                (in_stack_fffffffffffff470,
                 CONCAT44(in_stack_fffffffffffff46c,in_stack_fffffffffffff468),
                 (int64_t)in_stack_fffffffffffff460);
      Fad<float>::operator=(in_stack_fffffffffffff450,in_stack_fffffffffffff448);
      Fad<float>::~Fad(in_stack_fffffffffffff450);
    }
  }
  bVar1 = SolveEigenvaluesJacobi
                    (in_stack_fffffffffffffbd8,in_stack_fffffffffffffbd0,in_stack_fffffffffffffbc8,
                     in_stack_fffffffffffffbc0);
  if (bVar1) {
    Fad<float>::Fad<double,_nullptr>
              (in_stack_fffffffffffff460,
               (double *)CONCAT44(in_stack_fffffffffffff45c,in_stack_fffffffffffff458));
    TPZFNMatrix<3,_Fad<float>_>::TPZFNMatrix
              (in_stack_fffffffffffff4e0,in_stack_fffffffffffff4d8,
               CONCAT17(in_stack_fffffffffffff4d7,in_stack_fffffffffffff4d0),
               in_stack_fffffffffffff4c8);
    Fad<float>::~Fad(in_stack_fffffffffffff450);
    local_4d0 = 0;
    Fad<float>::Fad<double,_nullptr>
              (in_stack_fffffffffffff460,
               (double *)CONCAT44(in_stack_fffffffffffff45c,in_stack_fffffffffffff458));
    TPZFNMatrix<3,_Fad<float>_>::TPZFNMatrix
              (in_stack_fffffffffffff4e0,in_stack_fffffffffffff4d8,
               CONCAT17(in_stack_fffffffffffff4d7,in_stack_fffffffffffff4d0),
               in_stack_fffffffffffff4c8);
    Fad<float>::~Fad(in_stack_fffffffffffff450);
    (**(code **)(*local_30 + 0x68))(local_30,local_48);
    (**(code **)(*local_30 + 0x78))();
    for (local_4d8 = 0; local_4d8 < local_48; local_4d8 = local_4d8 + 1) {
      for (local_4e0 = 0; local_4e0 < local_48; local_4e0 = local_4e0 + 1) {
        local_504 = rand();
        Fad<float>::Fad<int,_nullptr>
                  (in_stack_fffffffffffff460,
                   (int *)CONCAT44(in_stack_fffffffffffff45c,in_stack_fffffffffffff458));
        TPZFMatrix<Fad<float>_>::PutVal
                  (in_stack_fffffffffffff470,
                   CONCAT44(in_stack_fffffffffffff46c,in_stack_fffffffffffff468),
                   (int64_t)in_stack_fffffffffffff460,
                   (Fad<float> *)CONCAT44(in_stack_fffffffffffff45c,in_stack_fffffffffffff458));
        Fad<float>::~Fad(in_stack_fffffffffffff450);
      }
      TPZFMatrix<Fad<float>_>::TPZFMatrix
                (in_stack_fffffffffffff500,
                 (TPZMatrix<Fad<float>_> *)
                 CONCAT44(in_stack_fffffffffffff4fc,in_stack_fffffffffffff4f8));
      TPZFNMatrix<9,_Fad<float>_>::TPZFNMatrix
                ((TPZFNMatrix<9,_Fad<float>_> *)
                 CONCAT44(in_stack_fffffffffffff4b4,in_stack_fffffffffffff4b0),
                 in_stack_fffffffffffff4a8);
      TPZFMatrix<Fad<float>_>::~TPZFMatrix((TPZFMatrix<Fad<float>_> *)0x1325d80);
      TPZVec<Fad<float>_>::operator[](local_28,local_4d8);
      Fad<float>::Fad(in_stack_fffffffffffff460,
                      (Fad<float> *)CONCAT44(in_stack_fffffffffffff45c,in_stack_fffffffffffff458));
      local_7d0 = 0x3ee4f8b588e368f1;
      Fad<float>::Fad<double,_nullptr>
                (in_stack_fffffffffffff460,
                 (double *)CONCAT44(in_stack_fffffffffffff45c,in_stack_fffffffffffff458));
      ReturnNearestValue(in_stack_fffffffffffff5e8,in_stack_fffffffffffff5e0,
                         in_stack_fffffffffffff5d8);
      Fad<float>::~Fad(in_stack_fffffffffffff450);
      Fad<float>::~Fad(in_stack_fffffffffffff450);
      TPZVec<Fad<float>_>::operator[](local_28,local_4d8);
      operator-<Fad<float>,_Fad<float>,_nullptr>
                (in_stack_fffffffffffff488,in_stack_fffffffffffff480);
      Fad<float>::Fad<FadBinaryMinus<Fad<float>,Fad<float>>>
                (in_stack_fffffffffffff490,
                 (FadExpr<FadBinaryMinus<Fad<float>,_Fad<float>_>_> *)in_stack_fffffffffffff488);
      FadExpr<FadBinaryMinus<Fad<float>,_Fad<float>_>_>::~FadExpr
                ((FadExpr<FadBinaryMinus<Fad<float>,_Fad<float>_>_> *)in_stack_fffffffffffff450);
      fVar2 = fabs<float>((Fad<float> *)0x1325e9f);
      if (fVar2 <= 1e-05) {
        for (local_8b8 = 0; local_8b8 < local_48; local_8b8 = local_8b8 + 1) {
          (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x24])(local_908,in_RDI,local_8b8);
          TPZVec<Fad<float>_>::operator[](local_28,local_4d8);
          Fad<float>::Fad<double,_nullptr>
                    (in_stack_fffffffffffff460,
                     (double *)CONCAT44(in_stack_fffffffffffff45c,in_stack_fffffffffffff458));
          operator-<Fad<float>,_Fad<float>,_nullptr>
                    (in_stack_fffffffffffff488,in_stack_fffffffffffff480);
          operator-<Fad<float>,_FadExpr<FadBinaryMinus<Fad<float>,_Fad<float>_>_>,_nullptr>
                    (in_stack_fffffffffffff488,
                     (FadExpr<FadBinaryMinus<Fad<float>,_Fad<float>_>_> *)in_stack_fffffffffffff480)
          ;
          Fad<float>::Fad<FadBinaryMinus<Fad<float>,FadExpr<FadBinaryMinus<Fad<float>,Fad<float>>>>>
                    (in_stack_fffffffffffff490,
                     (FadExpr<FadBinaryMinus<Fad<float>,_FadExpr<FadBinaryMinus<Fad<float>,_Fad<float>_>_>_>_>
                      *)in_stack_fffffffffffff488);
          TPZFMatrix<Fad<float>_>::PutVal
                    (in_stack_fffffffffffff470,
                     CONCAT44(in_stack_fffffffffffff46c,in_stack_fffffffffffff468),
                     (int64_t)in_stack_fffffffffffff460,
                     (Fad<float> *)CONCAT44(in_stack_fffffffffffff45c,in_stack_fffffffffffff458));
          Fad<float>::~Fad(in_stack_fffffffffffff450);
          FadExpr<FadBinaryMinus<Fad<float>,_FadExpr<FadBinaryMinus<Fad<float>,_Fad<float>_>_>_>_>::
          ~FadExpr((FadExpr<FadBinaryMinus<Fad<float>,_FadExpr<FadBinaryMinus<Fad<float>,_Fad<float>_>_>_>_>
                    *)in_stack_fffffffffffff450);
          FadExpr<FadBinaryMinus<Fad<float>,_Fad<float>_>_>::~FadExpr
                    ((FadExpr<FadBinaryMinus<Fad<float>,_Fad<float>_>_> *)in_stack_fffffffffffff450)
          ;
          Fad<float>::~Fad(in_stack_fffffffffffff450);
          Fad<float>::~Fad(in_stack_fffffffffffff450);
        }
      }
      else {
        for (local_808 = 0; local_808 < local_48; local_808 = local_808 + 1) {
          (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x24])(local_858,in_RDI,local_808);
          TPZVec<Fad<float>_>::operator[](local_28,local_4d8);
          fVar2 = fabs<float>((Fad<float> *)0x1325f53);
          local_8b0 = (double)fVar2 * 0.01;
          Fad<float>::Fad<double,_nullptr>
                    (in_stack_fffffffffffff460,
                     (double *)CONCAT44(in_stack_fffffffffffff45c,in_stack_fffffffffffff458));
          operator-<Fad<float>,_Fad<float>,_nullptr>
                    (in_stack_fffffffffffff488,in_stack_fffffffffffff480);
          Fad<float>::Fad<FadBinaryMinus<Fad<float>,Fad<float>>>
                    (in_stack_fffffffffffff490,
                     (FadExpr<FadBinaryMinus<Fad<float>,_Fad<float>_>_> *)in_stack_fffffffffffff488)
          ;
          operator-<Fad<float>,_Fad<float>,_nullptr>
                    (in_stack_fffffffffffff488,in_stack_fffffffffffff480);
          Fad<float>::Fad<FadBinaryMinus<Fad<float>,Fad<float>>>
                    (in_stack_fffffffffffff490,
                     (FadExpr<FadBinaryMinus<Fad<float>,_Fad<float>_>_> *)in_stack_fffffffffffff488)
          ;
          TPZFMatrix<Fad<float>_>::PutVal
                    (in_stack_fffffffffffff470,
                     CONCAT44(in_stack_fffffffffffff46c,in_stack_fffffffffffff468),
                     (int64_t)in_stack_fffffffffffff460,
                     (Fad<float> *)CONCAT44(in_stack_fffffffffffff45c,in_stack_fffffffffffff458));
          Fad<float>::~Fad(in_stack_fffffffffffff450);
          FadExpr<FadBinaryMinus<Fad<float>,_Fad<float>_>_>::~FadExpr
                    ((FadExpr<FadBinaryMinus<Fad<float>,_Fad<float>_>_> *)in_stack_fffffffffffff450)
          ;
          Fad<float>::~Fad(in_stack_fffffffffffff450);
          FadExpr<FadBinaryMinus<Fad<float>,_Fad<float>_>_>::~FadExpr
                    ((FadExpr<FadBinaryMinus<Fad<float>,_Fad<float>_>_> *)in_stack_fffffffffffff450)
          ;
          Fad<float>::~Fad(in_stack_fffffffffffff450);
          Fad<float>::~Fad(in_stack_fffffffffffff450);
        }
      }
      local_948 = 0.0;
      for (local_950 = 0; local_950 < local_48; local_950 = local_950 + 1) {
        in_stack_fffffffffffff500 =
             (TPZFMatrix<Fad<float>_> *)
             TPZFMatrix<Fad<float>_>::operator()
                       (in_stack_fffffffffffff470,
                        CONCAT44(in_stack_fffffffffffff46c,in_stack_fffffffffffff468),
                        (int64_t)in_stack_fffffffffffff460);
        in_stack_fffffffffffff4fc = fabs<float>((Fad<float> *)0x13264e2);
        TPZFMatrix<Fad<float>_>::operator()
                  (in_stack_fffffffffffff470,
                   CONCAT44(in_stack_fffffffffffff46c,in_stack_fffffffffffff468),
                   (int64_t)in_stack_fffffffffffff460);
        fVar2 = fabs<float>((Fad<float> *)0x132651d);
        local_948 = (double)(in_stack_fffffffffffff4fc * fVar2) + local_948;
      }
      sqrt(local_948);
      for (local_958 = 0; local_958 < local_48; local_958 = local_958 + 1) {
        TPZFMatrix<Fad<float>_>::operator()
                  (in_stack_fffffffffffff470,
                   CONCAT44(in_stack_fffffffffffff46c,in_stack_fffffffffffff468),
                   (int64_t)in_stack_fffffffffffff460);
        Fad<float>::Fad<double,_nullptr>
                  (in_stack_fffffffffffff460,
                   (double *)CONCAT44(in_stack_fffffffffffff45c,in_stack_fffffffffffff458));
        operator/<Fad<float>,_Fad<float>,_nullptr>
                  (in_stack_fffffffffffff488,in_stack_fffffffffffff480);
        TPZFMatrix<Fad<float>_>::operator()
                  (in_stack_fffffffffffff470,
                   CONCAT44(in_stack_fffffffffffff46c,in_stack_fffffffffffff468),
                   (int64_t)in_stack_fffffffffffff460);
        Fad<float>::operator=
                  ((Fad<float> *)in_stack_fffffffffffff470,
                   (FadExpr<FadBinaryDiv<Fad<float>,_Fad<float>_>_> *)
                   CONCAT44(in_stack_fffffffffffff46c,in_stack_fffffffffffff468));
        FadExpr<FadBinaryDiv<Fad<float>,_Fad<float>_>_>::~FadExpr
                  ((FadExpr<FadBinaryDiv<Fad<float>,_Fad<float>_>_> *)in_stack_fffffffffffff450);
        Fad<float>::~Fad(in_stack_fffffffffffff450);
      }
      local_998 = 10.0;
      for (local_990 = 0; local_40 < local_998 && local_990 <= local_38; local_990 = local_990 + 1)
      {
        for (local_9a8 = 0; local_9a8 < local_48; local_9a8 = local_9a8 + 1) {
          TPZFMatrix<Fad<float>_>::operator()
                    (in_stack_fffffffffffff470,
                     CONCAT44(in_stack_fffffffffffff46c,in_stack_fffffffffffff468),
                     (int64_t)in_stack_fffffffffffff460);
          TPZFMatrix<Fad<float>_>::operator()
                    (in_stack_fffffffffffff470,
                     CONCAT44(in_stack_fffffffffffff46c,in_stack_fffffffffffff468),
                     (int64_t)in_stack_fffffffffffff460);
          Fad<float>::operator=(in_stack_fffffffffffff450,in_stack_fffffffffffff448);
        }
        Solve_LU((TPZMatrix<Fad<float>_> *)in_stack_fffffffffffff460,
                 (TPZFMatrix<Fad<float>_> *)
                 CONCAT44(in_stack_fffffffffffff45c,in_stack_fffffffffffff458));
        local_9b0 = 0.0;
        for (local_9b8 = 0; local_9b8 < local_48; local_9b8 = local_9b8 + 1) {
          TPZFMatrix<Fad<float>_>::operator()
                    (in_stack_fffffffffffff470,
                     CONCAT44(in_stack_fffffffffffff46c,in_stack_fffffffffffff468),
                     (int64_t)in_stack_fffffffffffff460);
          in_stack_fffffffffffff4b4 = fabs<float>((Fad<float> *)0x1326824);
          in_stack_fffffffffffff4a8 =
               (TPZFMatrix<Fad<float>_> *)
               TPZFMatrix<Fad<float>_>::operator()
                         (in_stack_fffffffffffff470,
                          CONCAT44(in_stack_fffffffffffff46c,in_stack_fffffffffffff468),
                          (int64_t)in_stack_fffffffffffff460);
          fVar2 = fabs<float>((Fad<float> *)0x1326856);
          local_9b0 = (double)(in_stack_fffffffffffff4b4 * fVar2) + local_9b0;
        }
        sqrt(local_9b0);
        local_9a0 = 0.0;
        for (local_9c0 = 0; local_9c0 < local_48; local_9c0 = local_9c0 + 1) {
          TPZFMatrix<Fad<float>_>::operator()
                    (in_stack_fffffffffffff470,
                     CONCAT44(in_stack_fffffffffffff46c,in_stack_fffffffffffff468),
                     (int64_t)in_stack_fffffffffffff460);
          Fad<float>::Fad<double,_nullptr>
                    (in_stack_fffffffffffff460,
                     (double *)CONCAT44(in_stack_fffffffffffff45c,in_stack_fffffffffffff458));
          operator/<Fad<float>,_Fad<float>,_nullptr>
                    (in_stack_fffffffffffff488,in_stack_fffffffffffff480);
          in_stack_fffffffffffff490 =
               TPZFMatrix<Fad<float>_>::operator()
                         (in_stack_fffffffffffff470,
                          CONCAT44(in_stack_fffffffffffff46c,in_stack_fffffffffffff468),
                          (int64_t)in_stack_fffffffffffff460);
          Fad<float>::operator=
                    ((Fad<float> *)in_stack_fffffffffffff470,
                     (FadExpr<FadBinaryDiv<Fad<float>,_Fad<float>_>_> *)
                     CONCAT44(in_stack_fffffffffffff46c,in_stack_fffffffffffff468));
          FadExpr<FadBinaryDiv<Fad<float>,_Fad<float>_>_>::~FadExpr
                    ((FadExpr<FadBinaryDiv<Fad<float>,_Fad<float>_>_> *)in_stack_fffffffffffff450);
          Fad<float>::~Fad(in_stack_fffffffffffff450);
          in_stack_fffffffffffff488 =
               TPZFMatrix<Fad<float>_>::operator()
                         (in_stack_fffffffffffff470,
                          CONCAT44(in_stack_fffffffffffff46c,in_stack_fffffffffffff468),
                          (int64_t)in_stack_fffffffffffff460);
          in_stack_fffffffffffff480 =
               TPZFMatrix<Fad<float>_>::operator()
                         (in_stack_fffffffffffff470,
                          CONCAT44(in_stack_fffffffffffff46c,in_stack_fffffffffffff468),
                          (int64_t)in_stack_fffffffffffff460);
          operator-<Fad<float>,_Fad<float>,_nullptr>
                    (in_stack_fffffffffffff488,in_stack_fffffffffffff480);
          TPZFMatrix<Fad<float>_>::operator()
                    (in_stack_fffffffffffff470,
                     CONCAT44(in_stack_fffffffffffff46c,in_stack_fffffffffffff468),
                     (int64_t)in_stack_fffffffffffff460);
          in_stack_fffffffffffff470 =
               (TPZFMatrix<Fad<float>_> *)
               TPZFMatrix<Fad<float>_>::operator()
                         (in_stack_fffffffffffff470,
                          CONCAT44(in_stack_fffffffffffff46c,in_stack_fffffffffffff468),
                          (int64_t)in_stack_fffffffffffff460);
          operator-<Fad<float>,_Fad<float>,_nullptr>
                    (in_stack_fffffffffffff488,in_stack_fffffffffffff480);
          operator*<FadExpr<FadBinaryMinus<Fad<float>,_Fad<float>_>_>,_FadExpr<FadBinaryMinus<Fad<float>,_Fad<float>_>_>,_nullptr>
                    ((FadExpr<FadBinaryMinus<Fad<float>,_Fad<float>_>_> *)in_stack_fffffffffffff488,
                     (FadExpr<FadBinaryMinus<Fad<float>,_Fad<float>_>_> *)in_stack_fffffffffffff480)
          ;
          Fad<float>::
          Fad<FadBinaryMul<FadExpr<FadBinaryMinus<Fad<float>,Fad<float>>>,FadExpr<FadBinaryMinus<Fad<float>,Fad<float>>>>>
                    (in_stack_fffffffffffff490,
                     (FadExpr<FadBinaryMul<FadExpr<FadBinaryMinus<Fad<float>,_Fad<float>_>_>,_FadExpr<FadBinaryMinus<Fad<float>,_Fad<float>_>_>_>_>
                      *)in_stack_fffffffffffff488);
          FadExpr<FadBinaryMul<FadExpr<FadBinaryMinus<Fad<float>,_Fad<float>_>_>,_FadExpr<FadBinaryMinus<Fad<float>,_Fad<float>_>_>_>_>
          ::~FadExpr((FadExpr<FadBinaryMul<FadExpr<FadBinaryMinus<Fad<float>,_Fad<float>_>_>,_FadExpr<FadBinaryMinus<Fad<float>,_Fad<float>_>_>_>_>
                      *)in_stack_fffffffffffff450);
          FadExpr<FadBinaryMinus<Fad<float>,_Fad<float>_>_>::~FadExpr
                    ((FadExpr<FadBinaryMinus<Fad<float>,_Fad<float>_>_> *)in_stack_fffffffffffff450)
          ;
          FadExpr<FadBinaryMinus<Fad<float>,_Fad<float>_>_>::~FadExpr
                    ((FadExpr<FadBinaryMinus<Fad<float>,_Fad<float>_>_> *)in_stack_fffffffffffff450)
          ;
          in_stack_fffffffffffff46c = fabs<float>((Fad<float> *)0x1326a9f);
          local_9a0 = (double)in_stack_fffffffffffff46c + local_9a0;
          Fad<float>::~Fad(in_stack_fffffffffffff450);
        }
        local_998 = sqrt(local_9a0);
      }
      for (local_a48 = 0; local_a48 < local_48; local_a48 = local_a48 + 1) {
        in_stack_fffffffffffff460 =
             TPZFMatrix<Fad<float>_>::operator()
                       (in_stack_fffffffffffff470,
                        CONCAT44(in_stack_fffffffffffff46c,in_stack_fffffffffffff468),
                        (int64_t)in_stack_fffffffffffff460);
        Fad<float>::Fad(in_stack_fffffffffffff460,
                        (Fad<float> *)CONCAT44(in_stack_fffffffffffff45c,in_stack_fffffffffffff458))
        ;
        in_stack_fffffffffffff45c = fabs<float>((Fad<float> *)0x1326c57);
        if (in_stack_fffffffffffff45c < 1e-05) {
          Fad<float>::operator=<double,_nullptr>
                    (in_stack_fffffffffffff460,
                     (double *)CONCAT44(in_stack_fffffffffffff45c,in_stack_fffffffffffff458));
        }
        in_stack_fffffffffffff450 =
             TPZFMatrix<Fad<float>_>::operator()
                       (in_stack_fffffffffffff470,
                        CONCAT44(in_stack_fffffffffffff46c,in_stack_fffffffffffff468),
                        (int64_t)in_stack_fffffffffffff460);
        Fad<float>::operator=(in_stack_fffffffffffff450,in_stack_fffffffffffff448);
        Fad<float>::~Fad(in_stack_fffffffffffff450);
      }
      Fad<float>::~Fad(in_stack_fffffffffffff450);
      Fad<float>::~Fad(in_stack_fffffffffffff450);
      TPZFNMatrix<9,_Fad<float>_>::~TPZFNMatrix((TPZFNMatrix<9,_Fad<float>_> *)0x1326d47);
    }
    local_1 = 1;
    TPZFNMatrix<3,_Fad<float>_>::~TPZFNMatrix((TPZFNMatrix<3,_Fad<float>_> *)0x1326da9);
    TPZFNMatrix<3,_Fad<float>_>::~TPZFNMatrix((TPZFNMatrix<3,_Fad<float>_> *)0x1326db6);
  }
  else {
    local_1 = 0;
  }
  TPZFNMatrix<9,_Fad<float>_>::~TPZFNMatrix((TPZFNMatrix<9,_Fad<float>_> *)0x1326de1);
  return (bool)(local_1 & 1);
}

Assistant:

bool TPZMatrix<TVar>::SolveEigensystemJacobi(int64_t &numiterations, REAL & tol, TPZVec<TVar> & Eigenvalues, TPZFMatrix<TVar> & Eigenvectors) const{
	
	int64_t NumIt = numiterations;
	REAL tolerance = tol;
	
#ifdef PZDEBUG2
	if (this->Rows() != this->Cols())
	{
		PZError << __PRETTY_FUNCTION__ <<
		" - Jacobi method of computing eigensystem requires a symmetric square matrix. this->Rows = " << this->Rows() << " - this->Cols() = " << this->Cols() << endl;
		return false;
	}
	
	if (this->VerifySymmetry(1.e-8) == false)
	{
		PZError << __PRETTY_FUNCTION__ <<
		" - Jacobi method of computing eigensystem requires a symmetric square matrix. This matrix is not symmetric." << endl;
		return false;
	}
#endif
	
	const int64_t size = this->Rows();
	
	/** Making a copy of this */
	TPZFNMatrix<9,TVar> Matrix(size,size); //fast constructor in case of this is a stress or strain tensor.
	for(int64_t i = 0; i < size; i++) for(int64_t j = 0; j < size; j++) Matrix(i,j) = this->Get(i,j);
	
	/** Compute Eigenvalues *//////////////////////////////////////
	bool result = Matrix.SolveEigenvaluesJacobi(numiterations, tol, &Eigenvalues);
	if (result == false) return false;
	
	/** Compute Eigenvectors *//////////////////////////////////////
	TPZFNMatrix<3, TVar> VecIni(size,1,0.), VecIni_cp(size,1,0.);
	
	Eigenvectors.Resize(size, size);
	Eigenvectors.Zero();
	for(int64_t eigen = 0; eigen < size; eigen++)
	{
        for(int64_t i = 0; i < size; i++) VecIni.PutVal(i,0,rand());
		
        TPZFNMatrix<9,TVar> Matrix(*this);
		
        TVar answ = ReturnNearestValue(Eigenvalues[eigen], Eigenvalues,((TVar)1.E-5));
        TVar exp = answ - Eigenvalues[eigen];
        if((REAL)(fabs(exp)) > 1.E-5)
        {
            for(int64_t i = 0; i < size; i++) Matrix.PutVal(i,i, this->GetVal(i,i) - (TVar)(Eigenvalues[eigen] - (TVar)(0.01 * fabs(exp))) );
        }
        else
        {
            for(int64_t i = 0; i < size; i++) Matrix.PutVal(i,i, this->GetVal(i,i) - (Eigenvalues[eigen] - TVar(0.01)) );
        }
		
        /** Normalizing Initial Eigenvec */
        REAL norm1 = 0.;
        for(int64_t i = 0; i < size; i++) norm1 += fabs(VecIni(i,0)) * fabs(VecIni(i,0)); norm1 = sqrt(norm1);
        for(int64_t i = 0; i < size; i++) VecIni(i,0) = VecIni(i,0)/(TVar)norm1;
		
        int64_t count = 0;
        double dif = 10., difTemp = 0.;
		
        while(dif > tolerance && count <= NumIt)
        {
			for(int64_t i = 0; i < size; i++) VecIni_cp(i,0) = VecIni(i,0);
			
			/** Estimating Eigenvec */
			Matrix.Solve_LU(&VecIni);
			
			/** Normalizing Final Eigenvec */
			REAL norm2 = 0.;
			for(int64_t i = 0; i < size; i++) norm2 += fabs(VecIni(i,0)) * fabs(VecIni(i,0));
			norm2 = sqrt(norm2);
			
			difTemp = 0.;
			for(int64_t i = 0; i < size; i++)
			{
                VecIni(i,0) = VecIni(i,0)/(TVar)norm2;
                TVar exp = (VecIni_cp(i,0) - VecIni(i,0)) * (VecIni_cp(i,0) - VecIni(i,0));
                difTemp += fabs(exp);
			}
			dif = sqrt(difTemp);
			count++;
        }
		
        /** Copy values from AuxVector to Eigenvectors */
        for(int64_t i = 0; i < size; i++)
        {
			TVar val = VecIni(i,0);
			if((REAL)(fabs(val)) < 1.E-5) val = 0.;
			Eigenvectors(eigen,i) = val;
        }
		
#ifdef PZDEBUG2
        double norm = 0.;
        for(int64_t i = 0; i < size; i++) norm += fabs(VecIni(i,0)) * fabs(VecIni(i,0));
        if (fabs(norm - 1.) > 1.e-10)
        {
            PZError << __PRETTY_FUNCTION__ << endl;
        }
        if(count > NumIt-1)// O metodo nao convergiu !!!
        {
            PZError << __PRETTY_FUNCTION__ << endl;
#ifdef PZ_LOG
            {
                std::stringstream sout;
                Print("Matrix for SolveEigensystemJacobi did not converge",sout);
                LOGPZ_DEBUG(logger,sout.str());
            }
#endif
        }
#endif
	}
	
	return true;
	
}